

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::FindCMakeResources(char *argv0)

{
  bool bVar1;
  string exe_dir;
  string src_dir;
  string dir;
  string exe;
  string src_dir_txt;
  string errorMsg;
  string prefix;
  byte abStack_400 [488];
  ifstream fin2;
  byte abStack_1f8 [488];
  
  exe_dir._M_dataplus._M_p = (pointer)&exe_dir.field_2;
  exe_dir._M_string_length = 0;
  errorMsg._M_dataplus._M_p = (pointer)&errorMsg.field_2;
  errorMsg._M_string_length = 0;
  exe_dir.field_2._M_local_buf[0] = '\0';
  errorMsg.field_2._M_local_buf[0] = '\0';
  exe._M_dataplus._M_p = (pointer)&exe.field_2;
  exe._M_string_length = 0;
  exe.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::FindProgramPath
                    (argv0,&exe,&errorMsg,(char *)0x0,(char *)0x0,(char *)0x0);
  if (bVar1) {
    cmsys::SystemTools::GetRealPath(&prefix,&exe,(string *)0x0);
    std::__cxx11::string::operator=((string *)&exe,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    cmsys::SystemTools::GetFilenamePath(&prefix,&exe);
    std::__cxx11::string::operator=((string *)&exe_dir,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
  }
  cmsys::SystemTools::GetActualCaseForPath(&prefix,&exe_dir);
  std::__cxx11::string::operator=((string *)&exe_dir,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCommand_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCTestCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCTestCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCTestCommand_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCPackCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCPackCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCPackCommand_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMakeGUICommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeGUICommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMClDepsCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMClDepsCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"/bin",(allocator<char> *)&fin2);
  bVar1 = cmHasSuffix(&exe_dir,&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&exe_dir);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin2,
                   &prefix,"/share/cmake-3.15");
    std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    std::__cxx11::string::~string((string *)&prefix);
  }
  if (cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length != 0) {
    std::operator+(&prefix,&cmSystemToolsCMakeRoot_abi_cxx11_,"/Modules/CMake.cmake");
    bVar1 = cmsys::SystemTools::FileExists(&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (bVar1) goto LAB_0019ef7a;
  }
  cmsys::SystemTools::GetFilenamePath(&dir,&exe_dir);
  std::operator+(&src_dir_txt,&dir,"/CMakeFiles/CMakeSourceDir.txt");
  std::ifstream::ifstream(&prefix,src_dir_txt._M_dataplus._M_p,_S_in);
  src_dir._M_dataplus._M_p = (pointer)&src_dir.field_2;
  src_dir._M_string_length = 0;
  src_dir.field_2._M_local_buf[0] = '\0';
  if ((abStack_400[*(long *)(prefix._M_dataplus._M_p + -0x18)] & 5) == 0) {
    bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&prefix,&src_dir,(bool *)0x0,-1);
    if (!bVar1) goto LAB_0019ee70;
    bVar1 = cmsys::SystemTools::FileIsDirectory(&src_dir);
    if (!bVar1) goto LAB_0019ee70;
    std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
  }
  else {
LAB_0019ee70:
    cmsys::SystemTools::GetFilenamePath((string *)&fin2,&dir);
    std::__cxx11::string::operator=((string *)&dir,(string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin2,&dir,
                   "/CMakeFiles/CMakeSourceDir.txt");
    std::__cxx11::string::operator=((string *)&src_dir_txt,(string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    std::ifstream::ifstream(&fin2,src_dir_txt._M_dataplus._M_p,_S_in);
    if ((abStack_1f8[*(long *)(_fin2 + -0x18)] & 5) == 0) {
      bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin2,&src_dir,(bool *)0x0,-1);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsDirectory(&src_dir);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
        }
      }
    }
    std::ifstream::~ifstream(&fin2);
  }
  std::__cxx11::string::~string((string *)&src_dir);
  std::ifstream::~ifstream(&prefix);
  std::__cxx11::string::~string((string *)&src_dir_txt);
  std::__cxx11::string::~string((string *)&dir);
LAB_0019ef7a:
  std::__cxx11::string::~string((string *)&exe);
  std::__cxx11::string::~string((string *)&errorMsg);
  std::__cxx11::string::~string((string *)&exe_dir);
  return;
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while (start != s.end() && cm_isspace(*start)) {
    ++start;
  }
  if (start == s.end()) {
    return "";
  }
  std::string::const_iterator stop = s.end() - 1;
  while (cm_isspace(*stop)) {
    --stop;
  }
  return std::string(start, stop + 1);
}